

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# soul_ArrayWithPreallocation.h
# Opt level: O1

ArrayWithPreallocation<unsigned_char,_8UL> * __thiscall
soul::ArrayWithPreallocation<unsigned_char,_8UL>::operator=
          (ArrayWithPreallocation<unsigned_char,_8UL> *this,
          ArrayWithPreallocation<unsigned_char,_8UL> *other)

{
  size_t sVar1;
  ulong uVar2;
  
  this->numActive = 0;
  if (8 < this->numAllocated) {
    if (this->items != (uchar *)0x0) {
      operator_delete__(this->items);
    }
    this->items = (uchar *)this->space;
    this->numAllocated = 8;
  }
  uVar2 = other->numAllocated;
  if (uVar2 < 9) {
    sVar1 = other->numActive;
    this->numActive = sVar1;
    if (sVar1 != 0) {
      uVar2 = 0;
      do {
        this->items[uVar2] = other->items[uVar2];
        uVar2 = uVar2 + 1;
      } while (uVar2 < this->numActive);
    }
  }
  else {
    this->items = other->items;
    this->numActive = other->numActive;
    this->numAllocated = uVar2;
    other->items = (uchar *)other->space;
    other->numAllocated = 8;
    other->numActive = 0;
  }
  return this;
}

Assistant:

ArrayWithPreallocation& operator= (ArrayWithPreallocation&& other) noexcept
    {
        clear();

        if (other.isHeapAllocated())
        {
            items = other.items;
            numActive = other.numActive;
            numAllocated = other.numAllocated;
            other.resetToInternalStorage();
            other.numActive = 0;
        }
        else
        {
            numActive = other.numActive;

            for (size_t i = 0; i < numActive; ++i)
                new (items + i) Item (std::move (other.items[i]));
        }

        return *this;
    }